

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O3

void decode_nvrm_ioctl_create_unk34(nvrm_ioctl_create_unk34 *s)

{
  char *pcVar1;
  FILE *__stream;
  
  fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle: 0x%08x",nvrm_sep,(ulong)s->handle);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->handle,"handle");
  fprintf(_stdout,"%sparent: 0x%08x",nvrm_pfx,(ulong)s->parent);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid,s->parent,"parent");
  fprintf(_stdout,"%scid2: 0x%08x",nvrm_pfx,(ulong)s->cid2);
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"%shandle2: 0x%08x",nvrm_sep,(ulong)s->handle2);
  nvrm_pfx = nvrm_sep;
  describe_nvrm_object(s->cid2,s->handle2,"handle2");
  if (nvrm_show_unk_zero_fields != 0 || s->unk14 != 0) {
    fprintf(_stdout,"%sunk14: 0x%08x",nvrm_pfx);
  }
  __stream = _stdout;
  pcVar1 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  nvrm_status(s->status);
  fprintf(__stream,"%sstatus: %s",pcVar1,nvrm_status::buf);
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_unk34(struct nvrm_ioctl_create_unk34 *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_cid(s, cid2);
	nvrm_print_handle(s, handle2, cid2);
	nvrm_print_x32(s, unk14);
	nvrm_print_status(s, status);
	nvrm_print_ln();
}